

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O0

void ddClearLocal(DdNode *f)

{
  DdNode *f_local;
  
  if ((f->index != 0x7fffffff) && (((ulong)(f->type).kids.T & 1) != 0)) {
    (f->type).kids.T = (DdNode *)((ulong)(f->type).kids.T & 0xfffffffffffffffe);
    ddClearLocal((f->type).kids.T);
    ddClearLocal((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

static void
ddClearLocal(
  DdNode * f)
{
    if (cuddIsConstant(f) || !Cudd_IsComplement(cuddT(f))) {
        return;
    }
    /* clear visited flag */
    cuddT(f) = Cudd_Regular(cuddT(f));
    ddClearLocal(cuddT(f));
    ddClearLocal(Cudd_Regular(cuddE(f)));
    return;

}